

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

CappedArray<char,_5UL> __thiscall kj::_::Stringifier::operator*(Stringifier *this,char i)

{
  uint uVar1;
  size_t sVar2;
  uint8_t *puVar3;
  char *pcVar4;
  CappedArray<char,_5UL> CVar5;
  uint8_t reverse [4];
  CappedArray<char,_5UL> result;
  
  result.currentSize = 5;
  reverse[0] = '\0';
  reverse[1] = '\0';
  reverse[2] = '\0';
  reverse[3] = '\0';
  if (i == '\0') {
    puVar3 = reverse + 1;
    reverse[0] = '\0';
    reverse[1] = '\0';
    reverse[2] = '\0';
    reverse[3] = '\0';
  }
  else {
    puVar3 = reverse;
    for (uVar1 = (uint)(byte)((i ^ i >> 7) - (i >> 7)); uVar1 != 0; uVar1 = uVar1 / 10) {
      *puVar3 = (uint8_t)((ulong)uVar1 % 10);
      puVar3 = puVar3 + 1;
    }
    if (i < '\0') {
      pcVar4 = result.content + 1;
      result.content[0] = '-';
      goto LAB_001912de;
    }
  }
  pcVar4 = result.content;
LAB_001912de:
  sVar2 = (long)pcVar4 - (long)result.content;
  for (; reverse < puVar3; puVar3 = puVar3 + -1) {
    *pcVar4 = puVar3[-1] + '0';
    pcVar4 = pcVar4 + 1;
    sVar2 = sVar2 + 1;
  }
  CVar5._8_8_ = CONCAT71(result._9_7_,result.content[0]) & 0xffffffffff;
  CVar5.currentSize = sVar2;
  return CVar5;
}

Assistant:

inline explicit constexpr CappedArray(size_t s): currentSize(s) {}